

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.cpp
# Opt level: O2

Event __thiscall Storage::Disk::PCMSegmentEventSource::get_next_event(PCMSegmentEventSource *this)

{
  Time *pTVar1;
  ulong uVar2;
  ulong uVar3;
  element_type *peVar4;
  uint uVar5;
  size_type sVar6;
  reference rVar7;
  
  uVar3 = this->bit_pointer_;
  uVar5 = 0;
  if (uVar3 == 0) {
    uVar5 = -((((this->segment_).
                super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              length_of_a_bit).length >> 1);
  }
  (this->next_event_).length.length = uVar5;
  sVar6 = uVar3;
  while( true ) {
    peVar4 = (this->segment_).
             super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar2 = (ulong)*(uint *)((long)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data + 0x18) +
            ((long)(((_Bit_iterator *)
                    ((long)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
            *(long *)&(peVar4->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start) * 8;
    if (uVar2 <= sVar6) break;
    rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&peVar4->data,sVar6);
    uVar2 = *rVar7._M_p;
    peVar4 = (this->segment_).
             super___shared_ptr<Storage::Disk::PCMSegment,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sVar6 = this->bit_pointer_ + 1;
    this->bit_pointer_ = sVar6;
    pTVar1 = &(this->next_event_).length;
    pTVar1->length = pTVar1->length + (peVar4->length_of_a_bit).length;
    if ((uVar2 & rVar7._M_mask) != 0) goto LAB_003e3f7e;
    if ((*(_Bit_type **)
          &(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start !=
         (((_Bit_iterator *)
          ((long)&(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p) ||
       (*(uint *)((long)&(peVar4->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data + 0x18) != 0)) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&peVar4->fuzzy_mask,sVar6);
      if ((*rVar7._M_p & rVar7._M_mask) != 0) {
        uVar2 = (this->lfsr_).value_;
        (this->lfsr_).value_ = uVar2 >> 1 ^ (ulong)((uint)uVar2 & 1) * -0x7fffffffffffe61e;
        if ((uVar2 & 1) != 0) goto LAB_003e3f7e;
      }
    }
    sVar6 = this->bit_pointer_;
  }
  (this->next_event_).type = IndexHole;
  if (uVar3 <= uVar2) {
    pTVar1 = &(this->next_event_).length;
    pTVar1->length = pTVar1->length + ((peVar4->length_of_a_bit).length >> 1);
    this->bit_pointer_ = sVar6 + 1;
  }
LAB_003e3f7e:
  return this->next_event_;
}

Assistant:

Storage::Disk::Track::Event PCMSegmentEventSource::get_next_event() {
	// Track the initial bit pointer for potentially considering whether this was an
	// initial index hole or a subsequent one later on.
	const std::size_t initial_bit_pointer = bit_pointer_;

	// If starting from the beginning, pull half a bit backward, as if the initial bit
	// is set, it should be in the centre of its window.
	next_event_.length.length = bit_pointer_ ? 0 : -(segment_->length_of_a_bit.length >> 1);

	// search for the next bit that is set, if any
	while(bit_pointer_ < segment_->data.size()) {
		bool bit = segment_->data[bit_pointer_];
		++bit_pointer_;	// so this always points one beyond the most recent bit returned
		next_event_.length.length += segment_->length_of_a_bit.length;

		// if this bit is set, or is fuzzy and a random bit of 1 is selected, return the event.
		if(bit ||
			(!segment_->fuzzy_mask.empty() && segment_->fuzzy_mask[bit_pointer_] && lfsr_.next())
		)	return next_event_;
	}

	// If the end is reached without a bit being set, it'll be index holes from now on.
	next_event_.type = Track::Event::IndexHole;

	// Test whether this is the very first time that bits have been exhausted. If so then
	// allow an extra half bit's length to run from the position of the potential final transition
	// event to the end of the segment. Otherwise don't allow any extra time, as it's already
	// been consumed.
	if(initial_bit_pointer <= segment_->data.size()) {
		next_event_.length.length += (segment_->length_of_a_bit.length >> 1);
		bit_pointer_++;
	}
	return next_event_;
}